

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *puVar3;
  uint uVar4;
  long *in_RSI;
  long *in_RDI;
  CommentInfo *otherComment;
  int comment;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff88;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  CommentInfo *text;
  char *in_stack_ffffffffffffffb0;
  CommentInfo *this_00;
  CommentInfo *local_48;
  int local_20;
  
  *(char *)(in_RDI + 1) = (char)in_RSI[1];
  *(byte *)((long)in_RDI + 9) = *(byte *)((long)in_RDI + 9) & 0xfe;
  in_RDI[2] = 0;
  in_RDI[3] = in_RSI[3];
  in_RDI[4] = in_RSI[4];
  uVar4 = (uint)(ushort)*(byte *)(in_RDI + 1);
  if (3 < *(byte *)(in_RDI + 1)) {
    if (uVar4 == 4) {
      if (*in_RSI == 0) {
        *in_RDI = 0;
        *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfeff;
      }
      else {
        pcVar1 = duplicateStringValue
                           (in_stack_ffffffffffffffb0,
                            (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        *in_RDI = (long)pcVar1;
        *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfeff | 0x100;
      }
      goto LAB_0012be5a;
    }
    if (uVar4 != 5) {
      if (uVar4 - 6 < 2) {
        pvVar2 = operator_new(0x30);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::map(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *in_RDI = (long)pvVar2;
      }
      goto LAB_0012be5a;
    }
  }
  *in_RDI = *in_RSI;
LAB_0012be5a:
  if (in_RSI[2] != 0) {
    puVar3 = (undefined8 *)operator_new__(0x20);
    *puVar3 = 3;
    text = (CommentInfo *)(puVar3 + 1);
    this_00 = (CommentInfo *)(puVar3 + 4);
    local_48 = text;
    do {
      CommentInfo::CommentInfo(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != this_00);
    in_RDI[2] = (long)text;
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      if (*(long *)(in_RSI[2] + (long)local_20 * 8) != 0) {
        CommentInfo::setComment(this_00,(char *)text);
      }
    }
  }
  return;
}

Assistant:

Value::Value(const Value& other)
    : type_(other.type_), allocated_(false)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(other.start_), limit_(other.limit_) {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_) {
      value_.string_ = duplicateStringValue(other.value_.string_);
      allocated_ = true;
    } else {
      value_.string_ = 0;
      allocated_ = false;
    }
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
#else
  case arrayValue:
    value_.array_ = arrayAllocator()->newArrayCopy(*other.value_.array_);
    break;
  case objectValue:
    value_.map_ = mapAllocator()->newMapCopy(*other.value_.map_);
    break;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  if (other.comments_) {
    comments_ = new CommentInfo[numberOfCommentPlacement];
    for (int comment = 0; comment < numberOfCommentPlacement; ++comment) {
      const CommentInfo& otherComment = other.comments_[comment];
      if (otherComment.comment_)
        comments_[comment].setComment(otherComment.comment_);
    }
  }
}